

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  uint uVar6;
  long lVar7;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar8;
  char cVar9;
  ArrayIndex index;
  string *key;
  Json *pJVar10;
  double value_02;
  Members members;
  string local_68;
  Members local_48;
  
  bVar2 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar2) {
    return;
  }
  lVar7 = (long)&switchD_00178823::switchdataD_00187ac4 +
          (long)(int)(&switchD_00178823::switchdataD_00187ac4)[bVar2];
  uVar6 = (uint)lVar7;
  switch(bVar2) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 1:
    pJVar10 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar10,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 2:
    pJVar10 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar10,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 3:
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)0x0,value_02,true,uVar6);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 4:
    uVar6 = (uint)CONCAT71((int7)((ulong)lVar7 >> 8),bVar2 == 4);
    pJVar10 = (Json *)(value->value_).string_;
    if (pJVar10 == (Json *)0x0 || bVar2 != 4) {
      return;
    }
    if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
      pcVar8 = (char *)strlen((char *)pJVar10);
    }
    else {
      pcVar8 = (char *)(ulong)*(uint *)pJVar10;
      pJVar10 = pJVar10 + 4;
    }
    valueToQuotedStringN_abi_cxx11_(&local_68,pJVar10,pcVar8,uVar6);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    break;
  case 5:
    bVar3 = Value::asBool(value);
    pcVar8 = "false";
    if (bVar3) {
      pcVar8 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar8,pcVar8 + ((ulong)bVar3 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00178af7;
  case 6:
    cVar9 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar9);
    AVar4 = Value::size(value);
    if (AVar4 != 0) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::push_back(cVar9);
        }
        pVVar5 = Value::operator[](value,index);
        writeValue(this,pVVar5);
        index = index + 1;
      } while (AVar4 != index);
    }
    std::__cxx11::string::push_back(cVar9);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    psVar1 = &this->document_;
    cVar9 = (char)psVar1;
    std::__cxx11::string::push_back(cVar9);
    key = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back(cVar9);
        }
        valueToQuotedStringN_abi_cxx11_
                  (&local_68,(Json *)(key->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)key->_M_string_length,(uint)lVar7);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)psVar1);
        pVVar5 = Value::operator[](value,key);
        writeValue(this,pVVar5);
        key = key + 1;
      } while (key != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::push_back(cVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00178af7:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) document_ += valueToQuotedStringN(str, static_cast<unsigned>(end-str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (Value::Members::iterator it = members.begin(); it != members.end();
         ++it) {
      const JSONCPP_STRING& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), static_cast<unsigned>(name.length()));
      document_ += yamlCompatiblityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}